

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_set(void *p,HistEvent *ev,int n)

{
  history_t *h;
  int n_local;
  HistEvent *ev_local;
  void *p_local;
  
  if (*(int *)((long)p + 0x34) == 0) {
    ev->num = 5;
    ev->str = "empty list";
    p_local._4_4_ = -1;
  }
  else {
    if ((*(void **)((long)p + 0x28) == p) || (**(int **)((long)p + 0x28) != n)) {
      *(undefined8 *)((long)p + 0x28) = *(undefined8 *)((long)p + 0x18);
      while ((*(void **)((long)p + 0x28) != p && (**(int **)((long)p + 0x28) != n))) {
        *(undefined8 *)((long)p + 0x28) = *(undefined8 *)(*(long *)((long)p + 0x28) + 0x18);
      }
    }
    if (*(void **)((long)p + 0x28) == p) {
      ev->num = 9;
      ev->str = "event not found";
      p_local._4_4_ = -1;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_set(void *p, TYPE(HistEvent) *ev, const int n)
{
	history_t *h = (history_t *) p;

	if (h->cur == 0) {
		he_seterrev(ev, _HE_EMPTY_LIST);
		return -1;
	}
	if (h->cursor == &h->list || h->cursor->ev.num != n) {
		for (h->cursor = h->list.next; h->cursor != &h->list;
		    h->cursor = h->cursor->next)
			if (h->cursor->ev.num == n)
				break;
	}
	if (h->cursor == &h->list) {
		he_seterrev(ev, _HE_NOT_FOUND);
		return -1;
	}
	return 0;
}